

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  ImGuiInputTextState *in_RDI;
  int in_stack_00000094;
  STB_TexteditState *in_stack_00000098;
  ImGuiInputTextState *in_stack_000000a0;
  
  ImStb::stb_textedit_key(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  in_RDI->CursorFollow = true;
  CursorAnimReset(in_RDI);
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}